

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegalizeJSInterface.cpp
# Opt level: O2

Function * __thiscall
wasm::LegalizeJSInterface::tempSetter(LegalizeJSInterface *this,Module *module)

{
  Export *pEVar1;
  Function *pFVar2;
  Type in_R9;
  Name name;
  Name name_00;
  
  if (this->setTempRet0 != (Function *)0x0) {
    return this->setTempRet0;
  }
  if (this->exportedHelpers == true) {
    name.super_IString.str._M_str = DAT_00e63958;
    name.super_IString.str._M_len = SET_TEMP_RET_EXPORT;
    pEVar1 = Module::getExport(module,name);
    pFVar2 = Module::getFunction(module,(Name)(pEVar1->value).super_IString.str);
  }
  else {
    name_00.super_IString.str._M_str = (char *)0x2;
    name_00.super_IString.str._M_len = DAT_00e63978;
    pFVar2 = getFunctionOrImport((LegalizeJSInterface *)module,SET_TEMP_RET_IMPORT,name_00,(Type)0x0
                                 ,in_R9);
  }
  this->setTempRet0 = pFVar2;
  return pFVar2;
}

Assistant:

Function* tempSetter(Module* module) {
    if (!setTempRet0) {
      if (exportedHelpers) {
        auto* ex = module->getExport(SET_TEMP_RET_EXPORT);
        setTempRet0 = module->getFunction(ex->value);
      } else {
        setTempRet0 = getFunctionOrImport(
          module, SET_TEMP_RET_IMPORT, Type::i32, Type::none);
      }
    }
    return setTempRet0;
  }